

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::AddProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  Type *pTVar2;
  int *piVar3;
  code *pcVar4;
  Var value_00;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar5;
  ScriptContext *this_00;
  bool bVar6;
  BOOL BVar7;
  int iVar8;
  PropertyId propertyId_00;
  undefined4 *puVar9;
  PathTypeHandlerBase *pPVar10;
  PropertyRecord *pPVar11;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_01;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000081;
  Type *addr;
  Type *pTVar14;
  uint32 local_64;
  Var pvStack_60;
  uint32 indexVal;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_58;
  JavascriptLibrary *local_50;
  PropertyValueInfo *local_48;
  ScriptContext *local_40;
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000081,attributes);
  local_40 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  local_50 = (local_40->super_ScriptContextBase).javascriptLibrary;
  iVar8 = this->propertyCount;
  bVar6 = 0 < iVar8;
  local_48 = info;
  if (iVar8 < 1) {
LAB_00e5751f:
    if (bVar6) goto LAB_00e57523;
  }
  else {
    if ((this->descriptors[0].Id.ptr)->pid != propertyId) {
      uVar13 = 1;
      do {
        uVar12 = uVar13 & 0xffff;
        bVar6 = (int)uVar12 < iVar8;
        if (iVar8 <= (int)uVar12) break;
        uVar13 = uVar12 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar12 << 4)) + 8) !=
               propertyId);
      goto LAB_00e5751f;
    }
LAB_00e57523:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x451,"(!GetDescriptor(propertyId, &index))",
                                "!GetDescriptor(propertyId, &index)");
    if (!bVar6) goto LAB_00e57861;
    *puVar9 = 0;
  }
  BVar7 = ScriptContext::IsNumericPropertyId(local_40,propertyId,&local_64);
  if (BVar7 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x452,
                                "(!scriptContext->IsNumericPropertyId(propertyId, &indexVal))",
                                "!scriptContext->IsNumericPropertyId(propertyId, &indexVal)");
    if (!bVar6) goto LAB_00e57861;
    *puVar9 = 0;
  }
  if (this->propertyCount == 0) {
    pvStack_60 = value;
    pPVar11 = ScriptContext::GetPropertyName(local_40,propertyId);
    addr = this->descriptors + this->propertyCount;
    Memory::Recycler::WBSetBit((char *)addr);
    (addr->Id).ptr = pPVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->descriptors[this->propertyCount].field_1.Attributes = (Type)local_34;
    if ((local_34 & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
    }
    pTVar2 = &local_50->typesWithOnlyWritablePropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_58);
    local_58 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)pTVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
    pPVar5 = local_58;
    if (((local_34 & 4) == 0) &&
       (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
       this_00 = local_40, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_40,propertyId);
      ScriptContext::InvalidateStoreFieldCaches(this_00,propertyId_00);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar5);
    }
    pTVar14 = &local_50->typesWithNoSpecialPropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_58);
    local_58 = pTVar14;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
    pPVar5 = local_58;
    bVar6 = NoSpecialPropertyCache::IsSpecialProperty(propertyId);
    value_00 = pvStack_60;
    if ((bVar6) &&
       (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
       ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar5);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,this->propertyCount,value_00);
    iVar8 = this->propertyCount;
    if (local_48 != (PropertyValueInfo *)0x0) {
      local_48->m_instance = &instance->super_RecyclableObject;
      local_48->m_propertyIndex = (PropertyIndex)iVar8;
      local_48->m_attributes = (PropertyAttributes)local_34;
      local_48->flags = InlineCacheNoFlags;
    }
    this->propertyCount = iVar8 + 1;
    if (((this->super_DynamicTypeHandler).flags != '\0') ||
       (BVar7 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                          (&instance->super_RecyclableObject,propertyId), BVar7 != 0)) {
      ScriptContext::InvalidateProtoCaches(local_40,propertyId);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,value_00,possibleSideEffects);
    iVar8 = 1;
  }
  else {
    if (propertyId == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x457,"(propertyId != Constants::NoProperty)",
                                  "propertyId != Constants::NoProperty");
      if (!bVar6) {
LAB_00e57861:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    bVar6 = DoConvertToPathType((DynamicType *)(instance->super_RecyclableObject).type.ptr);
    if (bVar6) {
      pPVar10 = ConvertToPathType(this,instance);
      iVar8 = (*(pPVar10->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                        (pPVar10,instance,(ulong)(uint)propertyId,value,(ulong)(byte)local_34,
                         local_48,(ulong)flags,0xf);
    }
    else {
      pPVar11 = ScriptContext::GetPropertyName(local_40,propertyId);
      this_01 = SimpleTypeHandler<1ul>::
                ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                          ((SimpleTypeHandler<1ul> *)this,instance);
      piVar3 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr)->
                convertSimpleToSimpleDictionaryCount;
      *piVar3 = *piVar3 + 1;
      iVar8 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                          *)this_01,instance,pPVar11,value,(byte)local_34,local_48,flags,
                         possibleSideEffects);
    }
  }
  return iVar8;
}

Assistant:

BOOL SimpleTypeHandler<size>::AddProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();
#if DBG
        PropertyIndex index;
        uint32 indexVal;
        Assert(!GetDescriptor(propertyId, &index));
        Assert(!scriptContext->IsNumericPropertyId(propertyId, &indexVal));
#endif

        if (propertyCount >= sizeof(descriptors)/sizeof(SimplePropertyDescriptor))
        {
            Assert(propertyId != Constants::NoProperty);
            if (DoConvertToPathType(instance->GetDynamicType()))
            {
                return ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags);
            }
            else
            {
                PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
                return ConvertToSimpleDictionaryType(instance)->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
            }
        }

        descriptors[propertyCount].Id = scriptContext->GetPropertyName(propertyId);
        descriptors[propertyCount].Attributes = attributes;
        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);

        SetSlotUnchecked(instance, propertyCount, value);
        PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(propertyCount), attributes);
        propertyCount++;

        if ((this->GetFlags() && IsPrototypeFlag)
            || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        return true;
    }